

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

Value * __thiscall FReader::FindKey(FReader *this,char *key)

{
  uint uVar1;
  bool bVar2;
  SizeType SVar3;
  FJSONObject *pFVar4;
  Pointer pGVar5;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  MemberIterator it;
  Value *p;
  FJSONObject *obj;
  char *key_local;
  FReader *this_local;
  
  pFVar4 = TArray<FJSONObject,_FJSONObject>::Last(&this->mObjects);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(pFVar4->mObject);
  if (bVar2) {
    if (key == (char *)0x0) {
      this_local = (FReader *)this->mKeyValue;
      this->mKeyValue = (Value *)0x0;
    }
    else {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_38,(Ch *)pFVar4->mObject);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_48);
      rapidjson::
      GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericMemberIterator
                ((GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)(local_48 + 8),(NonConstIterator *)local_48);
      bVar2 = rapidjson::
              GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator==((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)local_38,(ConstIterator)local_48._8_8_);
      if (bVar2) {
        this_local = (FReader *)0x0;
      }
      else {
        pGVar5 = rapidjson::
                 GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)local_38);
        this_local = (FReader *)&pGVar5->value;
      }
    }
  }
  else {
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(pFVar4->mObject);
    if ((bVar2) &&
       (uVar1 = pFVar4->mIndex,
       SVar3 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Size(pFVar4->mObject), uVar1 < SVar3)) {
      SVar3 = pFVar4->mIndex;
      pFVar4->mIndex = SVar3 + 1;
      this_local = (FReader *)
                   rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::operator[](pFVar4->mObject,SVar3);
    }
    else {
      this_local = (FReader *)0x0;
    }
  }
  return (Value *)this_local;
}

Assistant:

rapidjson::Value *FindKey(const char *key)
	{
		FJSONObject &obj = mObjects.Last();
		
		if (obj.mObject->IsObject())
		{
			if (key == nullptr)
			{
				// we are performing an iteration of the object through GetKey.
				auto p = mKeyValue;
				mKeyValue = nullptr;
				return p;
			}
			else
			{
				// Find the given key by name;
				auto it = obj.mObject->FindMember(key);
				if (it == obj.mObject->MemberEnd()) return nullptr;
				return &it->value;
			}
		}
		else if (obj.mObject->IsArray() && (unsigned)obj.mIndex < obj.mObject->Size())
		{
			return &(*obj.mObject)[obj.mIndex++];
		}
		return nullptr;
	}